

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O2

int CheckChecksumUBX(uchar *packet,int packetlen)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  long lVar4;
  
  lVar1 = (long)packetlen + -2;
  uVar3 = '\0';
  uVar2 = '\0';
  for (lVar4 = 2; lVar4 < lVar1; lVar4 = lVar4 + 1) {
    uVar3 = uVar3 + packet[lVar4];
    uVar2 = uVar2 + uVar3;
  }
  if (packet[lVar1] == uVar3) {
    return (int)(packet[(long)packetlen + -1] != uVar2);
  }
  return 1;
}

Assistant:

inline int CheckChecksumUBX(unsigned char* packet, int packetlen)
{
	int i = 0;
	unsigned char CK_A = 0, CK_B = 0;

	for (i = 2; i < packetlen-2; i++)
	{
		CK_A = (unsigned char)(CK_A + packet[i]);
		CK_B = (unsigned char)(CK_B + CK_A);
	}
	if ((packet[packetlen-2] != CK_A)||(packet[packetlen-1] != CK_B))
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}